

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

void __thiscall Population::process(Population *this)

{
  ulong uVar1;
  Chromosome *chromo;
  pointer this_00;
  pointer pCVar2;
  long lVar3;
  undefined1 auVar4 [16];
  double dVar5;
  pointer local_30;
  pointer local_28;
  
  this_00 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar5 = 0.0;
  if (this_00 != pCVar2) {
    do {
      Chromosome::process(this_00);
      dVar5 = dVar5 + this_00->fitness;
      this_00 = this_00 + 1;
    } while (this_00 != pCVar2);
    this_00 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl
             .super__Vector_impl_data._M_finish;
  }
  if ((long)pCVar2 - (long)this_00 != 0) {
    uVar1 = ((long)pCVar2 - (long)this_00 >> 5) * -0x5555555555555555;
    lVar3 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    local_30 = this_00;
    local_28 = pCVar2;
    std::
    __introsort_loop<std::reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (&local_28,&local_30,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<Chromosome*,std::vector<Chromosome,std::allocator<Chromosome>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    this_00 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (this->chromosomes).super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl
             .super__Vector_impl_data._M_finish;
  }
  this->minFitness = pCVar2[-1].fitness;
  lVar3 = ((long)pCVar2 - (long)this_00 >> 5) * -0x5555555555555555;
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  this->maxFitness = this_00->fitness;
  this->averageFitness =
       dVar5 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  return;
}

Assistant:

void Population::process() {

    double totalFitness = 0;
    // re-calculate changed chromosomes
    for (Chromosome& chromo : chromosomes){
        chromo.process();
        totalFitness += chromo.getFitness();
    }
    // sort list by fitness
    std::sort(chromosomes.rbegin(), chromosomes.rend());
    // calculate min/max fitness of population

    minFitness = chromosomes.back().getFitness();
    maxFitness = chromosomes.front().getFitness();
    averageFitness = totalFitness/chromosomes.size();
}